

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcCurveBoundedPlane::IfcCurveBoundedPlane(IfcCurveBoundedPlane *this)

{
  *(undefined ***)&this->field_0x78 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x80 = 0;
  *(char **)&this->field_0x88 = "IfcCurveBoundedPlane";
  IfcBoundedSurface::IfcBoundedSurface
            (&this->super_IfcBoundedSurface,&PTR_construction_vtable_24__007df7d8);
  *(undefined8 *)&(this->super_IfcBoundedSurface).field_0x48 = 0;
  (this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x7df6f8;
  *(undefined8 *)&this->field_0x78 = 0x7df7c0;
  *(undefined8 *)
   &(this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x7df720;
  *(undefined8 *)
   &(this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x7df748;
  *(undefined8 *)
   &(this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.field_0x30
       = 0x7df770;
  *(undefined8 *)&(this->super_IfcBoundedSurface).super_IfcSurface.field_0x40 = 0x7df798;
  *(undefined8 *)&(this->super_IfcBoundedSurface).field_0x50 = 0;
  (this->OuterBoundary).obj = (LazyObject *)0x0;
  (this->InnerBoundaries).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->InnerBoundaries).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->InnerBoundaries).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

IfcCurveBoundedPlane() : Object("IfcCurveBoundedPlane") {}